

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::Fl_Browser_(Fl_Browser_ *this,int X,int Y,int W,int H,char *L)

{
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Browser_ *this_local;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Browser__002eada8;
  Fl_Scrollbar::Fl_Scrollbar(&this->scrollbar,0,0,0,0,(char *)0x0);
  Fl_Scrollbar::Fl_Scrollbar(&this->hscrollbar,0,0,0,0,(char *)0x0);
  Fl_Widget::box((Fl_Widget *)this,FL_NO_BOX);
  Fl_Widget::align((Fl_Widget *)this,2);
  this->real_position_ = 0;
  this->position_ = 0;
  this->real_hposition_ = 0;
  this->hposition_ = 0;
  this->offset_ = 0;
  this->top_ = (void *)0x0;
  Fl_Widget::when((Fl_Widget *)this,'\x06');
  this->selection_ = (void *)0x0;
  Fl_Widget::color((Fl_Widget *)this,7,0xf);
  Fl_Widget::callback((Fl_Widget *)&this->scrollbar,scrollbar_callback);
  Fl_Widget::callback((Fl_Widget *)&this->hscrollbar,hscrollbar_callback);
  Fl_Widget::type((Fl_Widget *)&this->hscrollbar,'\x01');
  this->textfont_ = 0;
  this->textsize_ = FL_NORMAL_SIZE;
  this->textcolor_ = 0;
  this->has_scrollbar_ = '\x03';
  this->max_width = 0;
  this->max_width_item = (void *)0x0;
  this->scrollbar_size_ = 0;
  this->redraw2 = (void *)0x0;
  this->redraw1 = (void *)0x0;
  Fl_Group::end(&this->super_Fl_Group);
  return;
}

Assistant:

Fl_Browser_::Fl_Browser_(int X, int Y, int W, int H, const char* L)
  : Fl_Group(X, Y, W, H, L),
    scrollbar(0, 0, 0, 0, 0), // they will be resized by draw()
    hscrollbar(0, 0, 0, 0, 0)
{
  box(FL_NO_BOX);
  align(FL_ALIGN_BOTTOM);
  position_ = real_position_ = 0;
  hposition_ = real_hposition_ = 0;
  offset_ = 0;
  top_ = 0;
  when(FL_WHEN_RELEASE_ALWAYS);
  selection_ = 0;
  color(FL_BACKGROUND2_COLOR, FL_SELECTION_COLOR);
  scrollbar.callback(scrollbar_callback);
//scrollbar.align(FL_ALIGN_LEFT|FL_ALIGN_BOTTOM); // back compatibility?
  hscrollbar.callback(hscrollbar_callback);
  hscrollbar.type(FL_HORIZONTAL);
  textfont_ = FL_HELVETICA;
  textsize_ = FL_NORMAL_SIZE;
  textcolor_ = FL_FOREGROUND_COLOR;
  has_scrollbar_ = BOTH;
  max_width = 0;
  max_width_item = 0;
  scrollbar_size_ = 0;
  redraw1 = redraw2 = 0;
  end();
}